

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

Node * __thiscall Parser::paren_expression(Node *__return_storage_ptr__,Parser *this)

{
  Node local_68;
  
  __return_storage_ptr__->_if = false;
  __return_storage_ptr__->_else = false;
  (__return_storage_ptr__->value)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->value).field_2;
  (__return_storage_ptr__->value)._M_string_length = 0;
  (__return_storage_ptr__->value).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->subnodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->subnodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->subnodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((this->lexer).lexem.type == OPAR) {
    Lexer::nextLexem(&this->lexer,&this->fin);
    expression(&local_68,this);
    __return_storage_ptr__->_if = local_68._if;
    __return_storage_ptr__->_else = local_68._else;
    __return_storage_ptr__->kind = local_68.kind;
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->value);
    std::vector<Node,_std::allocator<Node>_>::operator=
              (&__return_storage_ptr__->subnodes,&local_68.subnodes);
    std::vector<Node,_std::allocator<Node>_>::~vector(&local_68.subnodes);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.value._M_dataplus._M_p != &local_68.value.field_2) {
      operator_delete(local_68.value._M_dataplus._M_p,
                      local_68.value.field_2._M_allocated_capacity + 1);
    }
    if ((this->lexer).lexem.type == CPAR) {
      Lexer::nextLexem(&this->lexer,&this->fin);
      return __return_storage_ptr__;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\")\" expected",0xc);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\"(\" expected",0xc);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  exit(0);
}

Assistant:

Node Parser::paren_expression() {
    Node parenExpNode;
    if (getLexemType() != OPAR) {
        cout << "\"(\" expected" << endl;
        exit(0);
    }
    nextLexem();
    parenExpNode = expression();
    if (getLexemType() != CPAR) {
        cout << "\")\" expected" << endl;
        exit(0);
    }
    nextLexem();
    return parenExpNode;
}